

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O3

void __thiscall QColorDialogPrivate::retranslateStrings(QColorDialogPrivate *this)

{
  QLabel *pQVar1;
  QPushButton *pQVar2;
  long in_FS_OFFSET;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->super_QDialogPrivate).nativeDialogInUse == false) {
    if (this->smallDisplay == false) {
      pQVar1 = this->lblBasicColors;
      QMetaObject::tr((char *)&local_38,(char *)&QColorDialog::staticMetaObject,0x6e474d);
      QLabel::setText(pQVar1,&local_38);
      if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
        }
      }
      pQVar1 = this->lblCustomColors;
      QMetaObject::tr((char *)&local_38,(char *)&QColorDialog::staticMetaObject,0x6e475b);
      QLabel::setText(pQVar1,&local_38);
      if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
        }
      }
      pQVar2 = this->addCusBt;
      QMetaObject::tr((char *)&local_38,(char *)&QColorDialog::staticMetaObject,0x6e476a);
      QAbstractButton::setText(&pQVar2->super_QAbstractButton,&local_38);
      if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
        }
      }
      pQVar2 = this->eyeDropperButton;
      if (pQVar2 != (QPushButton *)0x0) {
        QMetaObject::tr((char *)&local_38,(char *)&QColorDialog::staticMetaObject,0x6e4780);
        QAbstractButton::setText(&pQVar2->super_QAbstractButton,&local_38);
        if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
    }
    QtPrivate::QColorShower::retranslateStrings(this->cs);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorDialogPrivate::retranslateStrings()
{
    if (nativeDialogInUse)
        return;

    if (!smallDisplay) {
        lblBasicColors->setText(QColorDialog::tr("&Basic colors"));
        lblCustomColors->setText(QColorDialog::tr("&Custom colors"));
        addCusBt->setText(QColorDialog::tr("&Add to Custom Colors"));
#if !defined(QT_SMALL_COLORDIALOG)
        if (eyeDropperButton)
            eyeDropperButton->setText(QColorDialog::tr("&Pick Screen Color"));
#endif
    }

    cs->retranslateStrings();
}